

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  pointer pcVar3;
  IResultCapture *pIVar4;
  AssertionResultData tempResult;
  SectionInfo testCaseSection;
  Counts assertions;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  AssertionResult result;
  Totals deltaTotals;
  string local_4f8;
  string local_4d8;
  undefined1 local_4b8 [40];
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  OfType local_470;
  undefined2 local_46c;
  SectionInfo local_468;
  Counts local_418;
  undefined1 local_400 [8];
  _Alloc_hider local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [18];
  TestCaseInfo local_288;
  SectionStats local_190;
  AssertionResult local_110;
  Totals local_68;
  
  local_4b8._0_8_ = (DecomposedExpression *)0x0;
  local_4b8._16_8_ = 0;
  local_4b8[0x18] = '\0';
  local_490._M_p = (pointer)&local_480;
  local_488 = 0;
  local_480._M_local_buf[0] = '\0';
  local_46c._0_1_ = false;
  local_46c._1_1_ = false;
  local_470 = FatalErrorCondition;
  local_4b8._8_8_ = local_4b8 + 0x18;
  std::__cxx11::string::_M_assign((string *)&local_490);
  AssertionResult::AssertionResult
            (&local_110,&this->m_lastAssertionInfo,(AssertionResultData *)local_4b8);
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[2])(pIVar4,&local_110);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            (&local_468,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  local_418.passed = 0;
  local_418.failedButOk = 0;
  local_418.failed = 1;
  SectionStats::SectionStats(&local_190,&local_468,&local_418,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&local_190);
  TestCaseInfo::TestCaseInfo(&local_288,&this->m_activeTestCase->super_TestCaseInfo);
  local_68.testCases.failedButOk = 0;
  local_68.assertions.failedButOk = 0;
  local_68.testCases.passed = 0;
  local_68.assertions.passed = 0;
  local_68.assertions.failed = 0;
  local_68.testCases.failed = 1;
  pIVar2 = (this->m_reporter).m_p;
  local_4d8._M_string_length = 0;
  local_4d8.field_2._M_local_buf[0] = '\0';
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_400,&local_288,&local_68,&local_4d8,&local_4f8,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,local_400);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_3f8._M_p = (pointer)0x0;
  local_3f0._M_local_buf[0] = '\0';
  local_400 = (undefined1  [8])&local_3f0;
  testGroupEnded(this,(string *)local_400,&this->m_totals,1,1);
  if (local_400 != (undefined1  [8])&local_3f0) {
    operator_delete((void *)local_400);
  }
  pIVar2 = (this->m_reporter).m_p;
  local_400 = (undefined1  [8])&PTR__TestRunStats_00161500;
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_3f8._M_p = local_3f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_3d8 = (undefined4)(this->m_totals).assertions.passed;
  uStack_3d4 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  uStack_3d0 = (undefined4)(this->m_totals).assertions.failed;
  uStack_3cc = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_3c8._M_allocated_capacity._0_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_3c8._M_allocated_capacity._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_3c8._8_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_3c8._12_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_3b8 = (undefined4)(this->m_totals).testCases.failed;
  uStack_3b4 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  uStack_3b0 = (undefined4)(this->m_totals).testCases.failedButOk;
  uStack_3ac = *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  local_3a8[0]._M_local_buf[0] = '\0';
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2);
  local_400 = (undefined1  [8])&PTR__TestRunStats_00161500;
  if (local_3f8._M_p != local_3f0._M_local_buf + 8) {
    operator_delete(local_3f8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.tagsAsString._M_dataplus._M_p != &local_288.tagsAsString.field_2) {
    operator_delete(local_288.tagsAsString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_288.lcaseTags._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_288.tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.description._M_dataplus._M_p != &local_288.description.field_2) {
    operator_delete(local_288.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.className._M_dataplus._M_p != &local_288.className.field_2) {
    operator_delete(local_288.className._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
    operator_delete(local_288.name._M_dataplus._M_p);
  }
  SectionStats::~SectionStats(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.description._M_dataplus._M_p != &local_468.description.field_2) {
    operator_delete(local_468.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.name._M_dataplus._M_p != &local_468.name.field_2) {
    operator_delete(local_468.name._M_dataplus._M_p);
  }
  AssertionResult::~AssertionResult(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_p != &local_480) {
    operator_delete(local_490._M_p);
  }
  if ((undefined1 *)local_4b8._8_8_ != local_4b8 + 0x18) {
    operator_delete((void *)local_4b8._8_8_);
  }
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            // Don't rebuild the result -- the stringification itself can cause more fatal errors
            // Instead, fake a result data.
            AssertionResultData tempResult;
            tempResult.resultType = ResultWas::FatalErrorCondition;
            tempResult.message = message;
            AssertionResult result(m_lastAssertionInfo, tempResult);

            getResultCapture().assertionEnded(result);

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        std::string(),
                                                        std::string(),
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( std::string(), m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }